

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O3

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenEnum_ObjectAPI
          (CSharpGenerator *this,EnumDef *enum_def,string *code_ptr,IDLOptions *opts)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  pointer pcVar5;
  EnumVal *pEVar6;
  StructDef *pSVar7;
  string *psVar8;
  size_type sVar9;
  EnumDef *pEVar10;
  CSharpGenerator *this_00;
  int iVar11;
  long *plVar12;
  undefined8 *puVar13;
  const_iterator cVar14;
  size_t sVar15;
  pointer ppEVar16;
  size_type *psVar17;
  long *plVar18;
  ulong *puVar19;
  pointer ppEVar20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  ulong uVar23;
  char *__s;
  size_type sVar24;
  string type_name;
  string accessibility;
  string lower_ev_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> union_name;
  string class_member;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string *local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378;
  string local_358;
  string local_338;
  long *local_318;
  long local_310;
  long local_308;
  long lStack_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  key_type local_2d8;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  EnumDef *local_298;
  CSharpGenerator *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  key_type local_228;
  IDLOptions *local_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  string local_100;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  _Base_ptr local_60;
  SymbolTable<flatbuffers::Value> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((enum_def->super_Definition).generated == false) && (enum_def->is_union == true)) {
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    local_208 = opts;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"private","");
    local_58 = &(enum_def->super_Definition).attributes;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            *)local_58,&local_2d8);
    local_60 = &(enum_def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                _M_header;
    local_290 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)code_ptr);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    pcVar5 = (enum_def->super_Definition).name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2d8,pcVar5,
               pcVar5 + (enum_def->super_Definition).name._M_string_length);
    std::__cxx11::string::append((char *)&local_2d8);
    local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
    local_3a0 = code_ptr;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Value","");
    if ((local_248._M_string_length == (enum_def->super_Definition).name._M_string_length) &&
       ((local_248._M_string_length == 0 ||
        (iVar11 = bcmp(local_248._M_dataplus._M_p,(enum_def->super_Definition).name._M_dataplus._M_p
                       ,local_248._M_string_length), iVar11 == 0)))) {
      std::__cxx11::string::append((char *)&local_248);
    }
    std::operator+(&local_3c0,"class ",&local_2d8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar8 = local_3a0;
    paVar1 = &local_3e0.field_2;
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0.field_2._8_8_ = plVar12[3];
      local_3e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_3e0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_3c0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_3c0,"  public ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0.field_2._8_8_ = plVar12[3];
      local_3e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_3e0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar8,(ulong)local_3e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_3c0,"  public object ",&local_248);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0.field_2._8_8_ = plVar12[3];
      local_3e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_3e0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar8,(ulong)local_3e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)psVar8);
    std::operator+(&local_3c0,"  public ",&local_2d8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar8 = local_3a0;
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0.field_2._8_8_ = plVar12[3];
      local_3e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_3e0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_398,"    this.Type = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)enum_def);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_398);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_228.field_2._M_allocated_capacity = *psVar17;
      local_228.field_2._8_8_ = plVar12[3];
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    }
    else {
      local_228.field_2._M_allocated_capacity = *psVar17;
      local_228._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_228._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_228,
                         (ulong)((*(enum_def->vals).vec.
                                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus.
                                _M_p);
    psVar17 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3c0.field_2._M_allocated_capacity = *psVar17;
      local_3c0.field_2._8_8_ = puVar13[3];
      local_3c0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_3c0.field_2._M_allocated_capacity = *psVar17;
      local_3c0._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_3c0._M_string_length = puVar13[1];
    *puVar13 = psVar17;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0.field_2._8_8_ = plVar12[3];
      local_3e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_3e0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar8,(ulong)local_3e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_dataplus._M_p != &local_398.field_2) {
      operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_3c0,"    this.",&local_248);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0.field_2._8_8_ = plVar12[3];
      local_3e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_3e0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar8,(ulong)local_3e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)psVar8);
    std::operator+(&local_3c0,"  public T As<T>() where T : class { return this.",&local_248);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0.field_2._8_8_ = plVar12[3];
      local_3e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_3e0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    ppEVar20 = (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppEVar16 = (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_298 = enum_def;
    if (ppEVar20 != ppEVar16) {
      do {
        pEVar6 = *ppEVar20;
        if ((pEVar6->union_type).base_type != BASE_TYPE_NONE) {
          GenTypeGet_ObjectAPI_abi_cxx11_(&local_3e0,local_290,pEVar6->union_type,local_208);
          BVar4 = (pEVar6->union_type).base_type;
          __s = "public";
          if (BVar4 == BASE_TYPE_STRUCT) {
            pSVar7 = (pEVar6->union_type).struct_def;
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"private","");
            cVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                             *)&(pSVar7->super_Definition).attributes,&local_228);
            __s = "public";
            if ((cVar14._M_node !=
                 &(pSVar7->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header.
                  _M_header) && (__s = "internal", *(long *)(cVar14._M_node + 2) == 0)) {
              __s = "public";
            }
          }
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          sVar15 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,__s,__s + sVar15);
          if ((BVar4 == BASE_TYPE_STRUCT) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2)) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_288,"  ",&local_3c0);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_288);
          local_2f8 = &local_2e8;
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_2e8 = *plVar18;
            lStack_2e0 = plVar12[3];
          }
          else {
            local_2e8 = *plVar18;
            local_2f8 = (long *)*plVar12;
          }
          local_2f0 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_2f8,(ulong)local_3e0._M_dataplus._M_p);
          local_2b8 = &local_2a8;
          puVar19 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar19) {
            local_2a8 = *puVar19;
            lStack_2a0 = plVar12[3];
          }
          else {
            local_2a8 = *puVar19;
            local_2b8 = (ulong *)*plVar12;
          }
          local_2b0 = plVar12[1];
          *plVar12 = (long)puVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
          local_318 = &local_308;
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_308 = *plVar18;
            lStack_300 = plVar12[3];
          }
          else {
            local_308 = *plVar18;
            local_318 = (long *)*plVar12;
          }
          local_310 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_318,(ulong)(pEVar6->name)._M_dataplus._M_p);
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          psVar17 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_358.field_2._M_allocated_capacity = *psVar17;
            local_358.field_2._8_8_ = plVar12[3];
          }
          else {
            local_358.field_2._M_allocated_capacity = *psVar17;
            local_358._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_358._M_string_length = plVar12[1];
          *plVar12 = (long)psVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_358);
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          psVar17 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_338.field_2._M_allocated_capacity = *psVar17;
            local_338.field_2._8_8_ = plVar12[3];
          }
          else {
            local_338.field_2._M_allocated_capacity = *psVar17;
            local_338._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_338._M_string_length = plVar12[1];
          *plVar12 = (long)psVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_338,(ulong)local_3e0._M_dataplus._M_p);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          psVar17 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_378.field_2._M_allocated_capacity = *psVar17;
            local_378.field_2._8_8_ = plVar12[3];
          }
          else {
            local_378.field_2._M_allocated_capacity = *psVar17;
            local_378._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_378._M_string_length = plVar12[1];
          *plVar12 = (long)psVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_378);
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          puVar19 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_398.field_2._M_allocated_capacity = *puVar19;
            local_398.field_2._8_8_ = plVar12[3];
          }
          else {
            local_398.field_2._M_allocated_capacity = *puVar19;
            local_398._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_398._M_string_length = plVar12[1];
          *plVar12 = (long)puVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_398._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308 + 1);
          }
          if (local_2b8 != &local_2a8) {
            operator_delete(local_2b8,local_2a8 + 1);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,local_2e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          pcVar5 = (pEVar6->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_398,pcVar5,pcVar5 + (pEVar6->name)._M_string_length);
          sVar9 = local_398._M_string_length;
          _Var22._M_p = local_398._M_dataplus._M_p;
          if (local_398._M_string_length != 0) {
            sVar24 = 0;
            do {
              iVar11 = tolower((uint)(byte)_Var22._M_p[sVar24]);
              _Var22._M_p[sVar24] = (char)iVar11;
              sVar24 = sVar24 + 1;
            } while (sVar9 != sVar24);
          }
          std::operator+(&local_50,"  ",&local_3c0);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_50);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_90 = *plVar18;
            lStack_88 = plVar12[3];
            local_a0 = &local_90;
          }
          else {
            local_90 = *plVar18;
            local_a0 = (long *)*plVar12;
          }
          local_98 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_a0,(ulong)local_2d8._M_dataplus._M_p);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_70 = *plVar18;
            lStack_68 = plVar12[3];
            local_80 = &local_70;
          }
          else {
            local_70 = *plVar18;
            local_80 = (long *)*plVar12;
          }
          local_78 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_80);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_1d0 = *plVar18;
            lStack_1c8 = plVar12[3];
            local_1e0 = &local_1d0;
          }
          else {
            local_1d0 = *plVar18;
            local_1e0 = (long *)*plVar12;
          }
          local_1d8 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_1e0,(ulong)(pEVar6->name)._M_dataplus._M_p);
          local_c0 = &local_b0;
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_b0 = *plVar18;
            lStack_a8 = plVar12[3];
          }
          else {
            local_b0 = *plVar18;
            local_c0 = (long *)*plVar12;
          }
          local_b8 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_c0);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_1b0 = *plVar18;
            lStack_1a8 = plVar12[3];
            local_1c0 = &local_1b0;
          }
          else {
            local_1b0 = *plVar18;
            local_1c0 = (long *)*plVar12;
          }
          local_1b8 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_1c0,(ulong)local_3e0._M_dataplus._M_p);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_190 = *plVar18;
            lStack_188 = plVar12[3];
            local_1a0 = &local_190;
          }
          else {
            local_190 = *plVar18;
            local_1a0 = (long *)*plVar12;
          }
          local_198 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_170 = *plVar18;
            lStack_168 = plVar12[3];
            local_180 = &local_170;
          }
          else {
            local_170 = *plVar18;
            local_180 = (long *)*plVar12;
          }
          local_178 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_180,(ulong)local_398._M_dataplus._M_p);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_150 = *plVar18;
            lStack_148 = plVar12[3];
            local_160 = &local_150;
          }
          else {
            local_150 = *plVar18;
            local_160 = (long *)*plVar12;
          }
          local_158 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_160);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_130 = *plVar18;
            lStack_128 = plVar12[3];
            local_140 = &local_130;
          }
          else {
            local_130 = *plVar18;
            local_140 = (long *)*plVar12;
          }
          local_138 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_140,(ulong)local_2d8._M_dataplus._M_p);
          plVar18 = plVar12 + 2;
          if ((long *)*plVar12 == plVar18) {
            local_110 = *plVar18;
            lStack_108 = plVar12[3];
            local_120 = &local_110;
          }
          else {
            local_110 = *plVar18;
            local_120 = (long *)*plVar12;
          }
          local_118 = plVar12[1];
          *plVar12 = (long)plVar18;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
          puVar19 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar19) {
            local_1f0 = *puVar19;
            lStack_1e8 = plVar12[3];
            local_200 = &local_1f0;
          }
          else {
            local_1f0 = *puVar19;
            local_200 = (ulong *)*plVar12;
          }
          local_1f8 = plVar12[1];
          *plVar12 = (long)puVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          EscapeKeyword(&local_e0,local_290,(string *)local_298);
          uVar23 = 0xf;
          if (local_200 != &local_1f0) {
            uVar23 = local_1f0;
          }
          if (uVar23 < local_e0._M_string_length + local_1f8) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              uVar21 = local_e0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_e0._M_string_length + local_1f8) goto LAB_001ac845;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,(ulong)local_200)
            ;
          }
          else {
LAB_001ac845:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_200,(ulong)local_e0._M_dataplus._M_p);
          }
          puVar19 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_268.field_2._M_allocated_capacity = *puVar19;
            local_268.field_2._8_8_ = puVar13[3];
            local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          }
          else {
            local_268.field_2._M_allocated_capacity = *puVar19;
            local_268._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_268._M_string_length = puVar13[1];
          *puVar13 = puVar19;
          puVar13[1] = 0;
          *(undefined1 *)puVar19 = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_268);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          puVar19 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_288.field_2._M_allocated_capacity = *puVar19;
            local_288.field_2._8_8_ = plVar12[3];
          }
          else {
            local_288.field_2._M_allocated_capacity = *puVar19;
            local_288._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_288._M_string_length = plVar12[1];
          *plVar12 = (long)puVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          EscapeKeyword(&local_100,local_290,&pEVar6->name);
          psVar8 = local_3a0;
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            uVar21 = local_288.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_100._M_string_length + local_288._M_string_length) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) {
              uVar21 = local_100.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_100._M_string_length + local_288._M_string_length)
            goto LAB_001ac9a6;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_100,0,(char *)0x0,(ulong)local_288._M_dataplus._M_p);
          }
          else {
LAB_001ac9a6:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_288,(ulong)local_100._M_dataplus._M_p);
          }
          local_2f8 = &local_2e8;
          plVar12 = puVar13 + 2;
          if ((long *)*puVar13 == plVar12) {
            local_2e8 = *plVar12;
            lStack_2e0 = puVar13[3];
          }
          else {
            local_2e8 = *plVar12;
            local_2f8 = (long *)*puVar13;
          }
          local_2f0 = puVar13[1];
          *puVar13 = plVar12;
          puVar13[1] = 0;
          *(undefined1 *)plVar12 = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_2f8);
          local_2b8 = &local_2a8;
          puVar19 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar19) {
            local_2a8 = *puVar19;
            lStack_2a0 = plVar12[3];
          }
          else {
            local_2a8 = *puVar19;
            local_2b8 = (ulong *)*plVar12;
          }
          local_2b0 = plVar12[1];
          *plVar12 = (long)puVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          puVar13 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_2b8,(ulong)local_248._M_dataplus._M_p);
          local_318 = &local_308;
          plVar12 = puVar13 + 2;
          if ((long *)*puVar13 == plVar12) {
            local_308 = *plVar12;
            lStack_300 = puVar13[3];
          }
          else {
            local_308 = *plVar12;
            local_318 = (long *)*puVar13;
          }
          local_310 = puVar13[1];
          *puVar13 = plVar12;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_318);
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          puVar19 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_358.field_2._M_allocated_capacity = *puVar19;
            local_358.field_2._8_8_ = plVar12[3];
          }
          else {
            local_358.field_2._M_allocated_capacity = *puVar19;
            local_358._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_358._M_string_length = plVar12[1];
          *plVar12 = (long)puVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_358,(ulong)local_398._M_dataplus._M_p);
          local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
          psVar17 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_338.field_2._M_allocated_capacity = *psVar17;
            local_338.field_2._8_8_ = plVar12[3];
          }
          else {
            local_338.field_2._M_allocated_capacity = *psVar17;
            local_338._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_338._M_string_length = plVar12[1];
          *plVar12 = (long)psVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_338);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          psVar17 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_378.field_2._M_allocated_capacity = *psVar17;
            local_378.field_2._8_8_ = puVar13[3];
          }
          else {
            local_378.field_2._M_allocated_capacity = *psVar17;
            local_378._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_378._M_string_length = puVar13[1];
          *puVar13 = psVar17;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar8,(ulong)local_378._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          if (local_318 != &local_308) {
            operator_delete(local_318,local_308 + 1);
          }
          if (local_2b8 != &local_2a8) {
            operator_delete(local_2b8,local_2a8 + 1);
          }
          if (local_2f8 != &local_2e8) {
            operator_delete(local_2f8,local_2e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_268._M_dataplus._M_p != &local_268.field_2) {
            operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
          if (local_200 != &local_1f0) {
            operator_delete(local_200,local_1f0 + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          if (local_140 != &local_130) {
            operator_delete(local_140,local_130 + 1);
          }
          if (local_160 != &local_150) {
            operator_delete(local_160,local_150 + 1);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180,local_170 + 1);
          }
          if (local_1a0 != &local_190) {
            operator_delete(local_1a0,local_190 + 1);
          }
          if (local_1c0 != &local_1b0) {
            operator_delete(local_1c0,local_1b0 + 1);
          }
          if (local_c0 != &local_b0) {
            operator_delete(local_c0,local_b0 + 1);
          }
          if (local_1e0 != &local_1d0) {
            operator_delete(local_1e0,local_1d0 + 1);
          }
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
          if (local_a0 != &local_90) {
            operator_delete(local_a0,local_90 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
          }
          ppEVar16 = (local_298->vals).vec.
                     super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        ppEVar20 = ppEVar20 + 1;
      } while (ppEVar20 != ppEVar16);
    }
    std::__cxx11::string::append((char *)local_3a0);
    pEVar10 = local_298;
    std::operator+(&local_3c0,
                   "  public static int Pack(Google.FlatBuffers.FlatBufferBuilder builder, ",
                   &local_2d8);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar8 = local_3a0;
    psVar17 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar17) {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0.field_2._8_8_ = plVar12[3];
      local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    }
    else {
      local_3e0.field_2._M_allocated_capacity = *psVar17;
      local_3e0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_3e0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar17;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)psVar8);
    ppEVar20 = (pEVar10->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar20 !=
        (pEVar10->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar1 = &local_378.field_2;
      do {
        pEVar6 = *ppEVar20;
        if ((pEVar6->union_type).base_type == BASE_TYPE_NONE) {
          std::__cxx11::string::append((char *)local_3a0);
        }
        else {
          EscapeKeyword(&local_338,local_290,(string *)local_298);
          puVar13 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x363ace);
          psVar17 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_378.field_2._M_allocated_capacity = *psVar17;
            local_378.field_2._8_8_ = puVar13[3];
            local_378._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_378.field_2._M_allocated_capacity = *psVar17;
            local_378._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_378._M_string_length = puVar13[1];
          *puVar13 = psVar17;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_378);
          local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
          puVar19 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar19) {
            local_398.field_2._M_allocated_capacity = *puVar19;
            local_398.field_2._8_8_ = plVar12[3];
          }
          else {
            local_398.field_2._M_allocated_capacity = *puVar19;
            local_398._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_398._M_string_length = plVar12[1];
          *plVar12 = (long)puVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          EscapeKeyword(&local_358,local_290,&pEVar6->name);
          uVar21 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            uVar21 = local_398.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar21 < local_358._M_string_length + local_398._M_string_length) {
            uVar21 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              uVar21 = local_358.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar21 < local_358._M_string_length + local_398._M_string_length)
            goto LAB_001ad256;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_358,0,(char *)0x0,(ulong)local_398._M_dataplus._M_p);
          }
          else {
LAB_001ad256:
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_398,(ulong)local_358._M_dataplus._M_p);
          }
          local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
          psVar17 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_3c0.field_2._M_allocated_capacity = *psVar17;
            local_3c0.field_2._8_8_ = puVar13[3];
          }
          else {
            local_3c0.field_2._M_allocated_capacity = *psVar17;
            local_3c0._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_3c0._M_string_length = puVar13[1];
          *puVar13 = psVar17;
          puVar13[1] = 0;
          *(undefined1 *)psVar17 = 0;
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
          local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
          psVar17 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_3e0.field_2._M_allocated_capacity = *psVar17;
            local_3e0.field_2._8_8_ = plVar12[3];
          }
          else {
            local_3e0.field_2._M_allocated_capacity = *psVar17;
            local_3e0._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_3e0._M_string_length = plVar12[1];
          *plVar12 = (long)psVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
            operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
            operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_dataplus._M_p != &local_398.field_2) {
            operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != paVar1) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338._M_dataplus._M_p != &local_338.field_2) {
            operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
          }
          if ((pEVar6->union_type).base_type == BASE_TYPE_STRING) {
            std::operator+(&local_3c0,"builder.CreateString(_o.As",&pEVar6->name);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
            local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
            psVar17 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_3e0.field_2._M_allocated_capacity = *psVar17;
              local_3e0.field_2._8_8_ = plVar12[3];
            }
            else {
              local_3e0.field_2._M_allocated_capacity = *psVar17;
              local_3e0._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_3e0._M_string_length = plVar12[1];
            *plVar12 = (long)psVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
              operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1
                             );
            }
            uVar21 = local_3c0.field_2._M_allocated_capacity;
            _Var22._M_p = local_3c0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
LAB_001ad63f:
              operator_delete(_Var22._M_p,uVar21 + 1);
            }
          }
          else {
            GenTypeGet_abi_cxx11_(&local_378,local_290,&pEVar6->union_type);
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_378);
            local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
            puVar19 = (ulong *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_398.field_2._M_allocated_capacity = *puVar19;
              local_398.field_2._8_8_ = plVar12[3];
            }
            else {
              local_398.field_2._M_allocated_capacity = *puVar19;
              local_398._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_398._M_string_length = plVar12[1];
            *plVar12 = (long)puVar19;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            puVar13 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_398,(ulong)(pEVar6->name)._M_dataplus._M_p);
            local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
            psVar17 = puVar13 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_3c0.field_2._M_allocated_capacity = *psVar17;
              local_3c0.field_2._8_8_ = puVar13[3];
            }
            else {
              local_3c0.field_2._M_allocated_capacity = *psVar17;
              local_3c0._M_dataplus._M_p = (pointer)*puVar13;
            }
            local_3c0._M_string_length = puVar13[1];
            *puVar13 = psVar17;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
            local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
            psVar17 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_3e0.field_2._M_allocated_capacity = *psVar17;
              local_3e0.field_2._8_8_ = plVar12[3];
            }
            else {
              local_3e0.field_2._M_allocated_capacity = *psVar17;
              local_3e0._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_3e0._M_string_length = plVar12[1];
            *plVar12 = (long)psVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
              operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
              operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
            uVar21 = local_378.field_2._M_allocated_capacity;
            _Var22._M_p = local_378._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != paVar1) goto LAB_001ad63f;
          }
        }
        ppEVar20 = ppEVar20 + 1;
      } while (ppEVar20 !=
               (local_298->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    psVar8 = local_3a0;
    std::__cxx11::string::append((char *)local_3a0);
    pEVar10 = local_298;
    paVar1 = &local_3c0.field_2;
    paVar2 = &local_3e0.field_2;
    paVar3 = &local_398.field_2;
    std::__cxx11::string::append((char *)psVar8);
    std::__cxx11::string::append((char *)psVar8);
    if (local_208->cs_gen_json_serializer == true) {
      local_3e0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"private","");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
              *)local_58,&local_3e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)local_3a0);
      std::operator+(&local_3c0,"class ",&local_2d8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)local_3a0);
      std::operator+(&local_378,"    return objectType == typeof(",&local_2d8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_378);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_398.field_2._M_allocated_capacity = *psVar17;
        local_398.field_2._8_8_ = plVar12[3];
        local_398._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_398.field_2._M_allocated_capacity = *psVar17;
        local_398._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_398._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_398,(ulong)local_2d8._M_dataplus._M_p);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3c0.field_2._M_allocated_capacity = *psVar17;
        local_3c0.field_2._8_8_ = plVar12[3];
        local_3c0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *psVar17;
        local_3c0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3c0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != paVar3) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      psVar8 = local_3a0;
      std::__cxx11::string::append((char *)local_3a0);
      std::__cxx11::string::append((char *)psVar8);
      std::operator+(&local_3c0,"    var _olist = value as System.Collections.Generic.List<",
                     &local_2d8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      psVar8 = local_3a0;
      std::__cxx11::string::append((char *)local_3a0);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::operator+(&local_3c0,"      this.WriteJson(writer, value as ",&local_2d8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      psVar8 = local_3a0;
      std::__cxx11::string::append((char *)local_3a0);
      std::__cxx11::string::append((char *)psVar8);
      std::operator+(&local_3c0,"  public void WriteJson(Newtonsoft.Json.JsonWriter writer, ",
                     &local_2d8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)local_3a0);
      std::operator+(&local_3c0,"    serializer.Serialize(writer, _o.",&local_248);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      psVar8 = local_3a0;
      std::__cxx11::string::append((char *)local_3a0);
      std::__cxx11::string::append((char *)psVar8);
      std::operator+(&local_3c0,"    var _olist = existingValue as System.Collections.Generic.List<"
                     ,&local_2d8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      psVar8 = local_3a0;
      std::__cxx11::string::append((char *)local_3a0);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::operator+(&local_3c0,"      return this.ReadJson(reader, existingValue as ",&local_2d8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      psVar8 = local_3a0;
      std::__cxx11::string::append((char *)local_3a0);
      std::__cxx11::string::append((char *)psVar8);
      std::operator+(&local_378,"  public ",&local_2d8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_378);
      puVar19 = (ulong *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar19) {
        local_398.field_2._M_allocated_capacity = *puVar19;
        local_398.field_2._8_8_ = plVar12[3];
        local_398._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_398.field_2._M_allocated_capacity = *puVar19;
        local_398._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_398._M_string_length = plVar12[1];
      *plVar12 = (long)puVar19;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_398,(ulong)local_2d8._M_dataplus._M_p);
      psVar17 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3c0.field_2._M_allocated_capacity = *psVar17;
        local_3c0.field_2._8_8_ = puVar13[3];
        local_3c0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *psVar17;
        local_3c0._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_3c0._M_string_length = puVar13[1];
      *puVar13 = psVar17;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar17 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0.field_2._8_8_ = plVar12[3];
        local_3e0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3e0.field_2._M_allocated_capacity = *psVar17;
        local_3e0._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_3e0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_dataplus._M_p != paVar2) {
        operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != paVar3) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      psVar8 = local_3a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      this_00 = local_290;
      ppEVar20 = (pEVar10->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppEVar20 !=
          (pEVar10->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          pEVar6 = *ppEVar20;
          if ((pEVar6->union_type).base_type == BASE_TYPE_NONE) {
            std::__cxx11::string::append((char *)local_3a0);
          }
          else {
            GenTypeGet_ObjectAPI_abi_cxx11_(&local_3e0,this_00,pEVar6->union_type,local_208);
            EscapeKeyword(&local_288,this_00,(string *)local_298);
            puVar13 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,0x363ace);
            plVar12 = puVar13 + 2;
            if ((long *)*puVar13 == plVar12) {
              local_2e8 = *plVar12;
              lStack_2e0 = puVar13[3];
              local_2f8 = &local_2e8;
            }
            else {
              local_2e8 = *plVar12;
              local_2f8 = (long *)*puVar13;
            }
            local_2f0 = puVar13[1];
            *puVar13 = plVar12;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_2f8);
            puVar19 = (ulong *)(plVar12 + 2);
            if ((ulong *)*plVar12 == puVar19) {
              local_2a8 = *puVar19;
              lStack_2a0 = plVar12[3];
              local_2b8 = &local_2a8;
            }
            else {
              local_2a8 = *puVar19;
              local_2b8 = (ulong *)*plVar12;
            }
            local_2b0 = plVar12[1];
            *plVar12 = (long)puVar19;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            EscapeKeyword(&local_268,local_290,&pEVar6->name);
            uVar23 = 0xf;
            if (local_2b8 != &local_2a8) {
              uVar23 = local_2a8;
            }
            if (uVar23 < local_268._M_string_length + local_2b0) {
              uVar21 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_268._M_dataplus._M_p != &local_268.field_2) {
                uVar21 = local_268.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar21 < local_268._M_string_length + local_2b0) goto LAB_001ae2c2;
              puVar13 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_268,0,(char *)0x0,(ulong)local_2b8);
            }
            else {
LAB_001ae2c2:
              puVar13 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_2b8,(ulong)local_268._M_dataplus._M_p);
            }
            local_318 = &local_308;
            plVar12 = puVar13 + 2;
            if ((long *)*puVar13 == plVar12) {
              local_308 = *plVar12;
              lStack_300 = puVar13[3];
            }
            else {
              local_308 = *plVar12;
              local_318 = (long *)*puVar13;
            }
            local_310 = puVar13[1];
            *puVar13 = plVar12;
            puVar13[1] = 0;
            *(undefined1 *)plVar12 = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_318);
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            puVar19 = (ulong *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_358.field_2._M_allocated_capacity = *puVar19;
              local_358.field_2._8_8_ = plVar12[3];
            }
            else {
              local_358.field_2._M_allocated_capacity = *puVar19;
              local_358._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_358._M_string_length = plVar12[1];
            *plVar12 = (long)puVar19;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_358,(ulong)local_248._M_dataplus._M_p);
            local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
            psVar17 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_338.field_2._M_allocated_capacity = *psVar17;
              local_338.field_2._8_8_ = plVar12[3];
            }
            else {
              local_338.field_2._M_allocated_capacity = *psVar17;
              local_338._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_338._M_string_length = plVar12[1];
            *plVar12 = (long)psVar17;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_338);
            local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
            psVar17 = puVar13 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_378.field_2._M_allocated_capacity = *psVar17;
              local_378.field_2._8_8_ = puVar13[3];
            }
            else {
              local_378.field_2._M_allocated_capacity = *psVar17;
              local_378._M_dataplus._M_p = (pointer)*puVar13;
            }
            local_378._M_string_length = puVar13[1];
            *puVar13 = psVar17;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_378,(ulong)local_3e0._M_dataplus._M_p);
            local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
            puVar19 = (ulong *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar19) {
              local_398.field_2._M_allocated_capacity = *puVar19;
              local_398.field_2._8_8_ = plVar12[3];
            }
            else {
              local_398.field_2._M_allocated_capacity = *puVar19;
              local_398._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_398._M_string_length = plVar12[1];
            *plVar12 = (long)puVar19;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_398);
            local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
            psVar17 = puVar13 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_3c0.field_2._M_allocated_capacity = *psVar17;
              local_3c0.field_2._8_8_ = puVar13[3];
            }
            else {
              local_3c0.field_2._M_allocated_capacity = *psVar17;
              local_3c0._M_dataplus._M_p = (pointer)*puVar13;
            }
            local_3c0._M_string_length = puVar13[1];
            *puVar13 = psVar17;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_3a0,(ulong)local_3c0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
              operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_398._M_dataplus._M_p != &local_398.field_2) {
              operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_378._M_dataplus._M_p != &local_378.field_2) {
              operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p != &local_338.field_2) {
              operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_318 != &local_308) {
              operator_delete(local_318,local_308 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_2b8 != &local_2a8) {
              operator_delete(local_2b8,local_2a8 + 1);
            }
            if (local_2f8 != &local_2e8) {
              operator_delete(local_2f8,local_2e8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_288._M_dataplus._M_p != &local_288.field_2) {
              operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
              operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          ppEVar20 = ppEVar20 + 1;
        } while (ppEVar20 !=
                 (local_298->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      psVar8 = local_3a0;
      std::__cxx11::string::append((char *)local_3a0);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
      std::__cxx11::string::append((char *)psVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenEnum_ObjectAPI(EnumDef &enum_def, std::string *code_ptr,
                         const IDLOptions &opts) const {
    auto &code = *code_ptr;
    if (enum_def.generated) return;
    if (!enum_def.is_union) return;
    if (enum_def.attributes.Lookup("private")) {
      code += "internal ";
    } else {
      code += "public ";
    }
    auto union_name = enum_def.name + "Union";
    auto class_member = std::string("Value");
    if (class_member == enum_def.name) { class_member += "_"; };
    code += "class " + union_name + " {\n";
    // Type
    code += "  public " + enum_def.name + " Type { get; set; }\n";
    // Value
    code += "  public object " + class_member + " { get; set; }\n";
    code += "\n";
    // Constructor
    code += "  public " + union_name + "() {\n";
    code += "    this.Type = " + enum_def.name + "." +
            enum_def.Vals()[0]->name + ";\n";
    code += "    this." + class_member + " = null;\n";
    code += "  }\n\n";
    // As<T>
    code += "  public T As<T>() where T : class { return this." + class_member +
            " as T; }\n";
    // As, From
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (ev.union_type.base_type == BASE_TYPE_NONE) continue;
      auto type_name = GenTypeGet_ObjectAPI(ev.union_type, opts);
      std::string accessibility =
          (ev.union_type.base_type == BASE_TYPE_STRUCT &&
           ev.union_type.struct_def->attributes.Lookup("private"))
              ? "internal"
              : "public";
      // As
      code += "  " + accessibility + " " + type_name + " As" + ev.name +
              "() { return this.As<" + type_name + ">(); }\n";
      // From
      auto lower_ev_name = ev.name;
      std::transform(lower_ev_name.begin(), lower_ev_name.end(),
                     lower_ev_name.begin(), CharToLower);
      code += "  " + accessibility + " static " + union_name + " From" +
              ev.name + "(" + type_name + " _" + lower_ev_name +
              ") { return new " + union_name + "{ Type = " + Name(enum_def) +
              "." + Name(ev) + ", " + class_member + " = _" + lower_ev_name +
              " }; }\n";
    }
    code += "\n";
    // Pack()
    code +=
        "  public static int Pack(Google.FlatBuffers.FlatBufferBuilder "
        "builder, " +
        union_name + " _o) {\n";
    code += "    switch (_o.Type) {\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        code += "      default: return 0;\n";
      } else {
        code += "      case " + Name(enum_def) + "." + Name(ev) + ": return ";
        if (IsString(ev.union_type)) {
          code += "builder.CreateString(_o.As" + ev.name + "()).Value;\n";
        } else {
          code += GenTypeGet(ev.union_type) + ".Pack(builder, _o.As" + ev.name +
                  "()).Value;\n";
        }
      }
    }
    code += "    }\n";
    code += "  }\n";
    code += "}\n\n";

    // JsonConverter
    if (opts.cs_gen_json_serializer) {
      if (enum_def.attributes.Lookup("private")) {
        code += "internal ";
      } else {
        code += "public ";
      }
      code += "class " + union_name +
              "_JsonConverter : Newtonsoft.Json.JsonConverter {\n";
      code += "  public override bool CanConvert(System.Type objectType) {\n";
      code += "    return objectType == typeof(" + union_name +
              ") || objectType == typeof(System.Collections.Generic.List<" +
              union_name + ">);\n";
      code += "  }\n";
      code +=
          "  public override void WriteJson(Newtonsoft.Json.JsonWriter writer, "
          "object value, "
          "Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    var _olist = value as System.Collections.Generic.List<" +
              union_name + ">;\n";
      code += "    if (_olist != null) {\n";
      code += "      writer.WriteStartArray();\n";
      code +=
          "      foreach (var _o in _olist) { this.WriteJson(writer, _o, "
          "serializer); }\n";
      code += "      writer.WriteEndArray();\n";
      code += "    } else {\n";
      code += "      this.WriteJson(writer, value as " + union_name +
              ", serializer);\n";
      code += "    }\n";
      code += "  }\n";
      code += "  public void WriteJson(Newtonsoft.Json.JsonWriter writer, " +
              union_name +
              " _o, "
              "Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    if (_o == null) return;\n";
      code += "    serializer.Serialize(writer, _o." + class_member + ");\n";
      code += "  }\n";
      code +=
          "  public override object ReadJson(Newtonsoft.Json.JsonReader "
          "reader, "
          "System.Type objectType, "
          "object existingValue, Newtonsoft.Json.JsonSerializer serializer) "
          "{\n";
      code +=
          "    var _olist = existingValue as System.Collections.Generic.List<" +
          union_name + ">;\n";
      code += "    if (_olist != null) {\n";
      code += "      for (var _j = 0; _j < _olist.Count; ++_j) {\n";
      code += "        reader.Read();\n";
      code +=
          "        _olist[_j] = this.ReadJson(reader, _olist[_j], "
          "serializer);\n";
      code += "      }\n";
      code += "      reader.Read();\n";
      code += "      return _olist;\n";
      code += "    } else {\n";
      code += "      return this.ReadJson(reader, existingValue as " +
              union_name + ", serializer);\n";
      code += "    }\n";
      code += "  }\n";
      code += "  public " + union_name +
              " ReadJson(Newtonsoft.Json.JsonReader reader, " + union_name +
              " _o, Newtonsoft.Json.JsonSerializer serializer) {\n";
      code += "    if (_o == null) return null;\n";
      code += "    switch (_o.Type) {\n";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        auto &ev = **it;
        if (ev.union_type.base_type == BASE_TYPE_NONE) {
          code += "      default: break;\n";
        } else {
          auto type_name = GenTypeGet_ObjectAPI(ev.union_type, opts);
          code += "      case " + Name(enum_def) + "." + Name(ev) + ": _o." +
                  class_member + " = serializer.Deserialize<" + type_name +
                  ">(reader); break;\n";
        }
      }
      code += "    }\n";
      code += "    return _o;\n";
      code += "  }\n";
      code += "}\n\n";
    }
  }